

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

void ZSTD_initFseState(ZSTD_fseState *DStatePtr,BIT_DStream_t *bitD,ZSTD_seqSymbol *dt)

{
  size_t sVar1;
  ZSTD_seqSymbol_header *DTableH;
  void *ptr;
  ZSTD_seqSymbol *dt_local;
  BIT_DStream_t *bitD_local;
  ZSTD_fseState *DStatePtr_local;
  
  sVar1 = BIT_readBits(bitD,dt->baseValue);
  DStatePtr->state = sVar1;
  BIT_reloadDStream(bitD);
  DStatePtr->table = dt + 1;
  return;
}

Assistant:

static void
ZSTD_initFseState(ZSTD_fseState* DStatePtr, BIT_DStream_t* bitD, const ZSTD_seqSymbol* dt)
{
    const void* ptr = dt;
    const ZSTD_seqSymbol_header* const DTableH = (const ZSTD_seqSymbol_header*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    DEBUGLOG(6, "ZSTD_initFseState : val=%u using %u bits",
                (U32)DStatePtr->state, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}